

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool Json::containsNewLine(Location begin,Location end)

{
  Location end_local;
  Location begin_local;
  
  begin_local = begin;
  while( true ) {
    if (end <= begin_local) {
      return false;
    }
    if ((*begin_local == '\n') || (*begin_local == '\r')) break;
    begin_local = begin_local + 1;
  }
  return true;
}

Assistant:

static bool containsNewLine(Reader::Location begin, Reader::Location end) {
  for (; begin < end; ++begin)
    if (*begin == '\n' || *begin == '\r')
      return true;
  return false;
}